

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

void __thiscall Clasp::Asp::PrgAtom::removeDep(PrgAtom *this,Var bodyId,bool pos)

{
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *this_00;
  Literal *pLVar1;
  iterator pLVar2;
  byte in_DL;
  Var in_ESI;
  Literal *in_RDI;
  iterator it;
  iterator in_stack_ffffffffffffffb8;
  Literal *in_stack_ffffffffffffffd8;
  Literal *in_stack_ffffffffffffffe0;
  
  this_00 = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                      ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 8));
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 8));
  Literal::Literal((Literal *)&stack0xffffffffffffffe4,in_ESI,(bool)((in_DL & 1 ^ 0xff) & 1));
  pLVar1 = std::find<Clasp::Literal*,Clasp::Literal>
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  pLVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                     ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 8));
  if (pLVar1 != pLVar2) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase
              (this_00,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void PrgAtom::removeDep(Var bodyId, bool pos) {
	LitVec::iterator it = std::find(deps_.begin(), deps_.end(), Literal(bodyId, !pos));
	if (it != deps_.end()) { deps_.erase(it); }
}